

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::Add<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,int propertyIndex,
          JavascriptString *propertyKey,PropertyAttributes attributes,bool isInitialized,
          bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  long lVar2;
  code *pcVar3;
  DynamicTypeHandler *this_00;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar4;
  bool bVar5;
  PropertyId propertyId;
  undefined4 *puVar6;
  undefined7 in_register_00000009;
  SimpleDictionaryPropertyDescriptor<int> local_50;
  DynamicTypeHandler *local_48;
  uint local_3c;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_38;
  
  if (propertyKey != (JavascriptString *)0x0) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_3c = (uint)CONCAT71(in_register_00000009,attributes);
    local_50.Attributes = attributes;
    local_50.propertyIndex = propertyIndex;
    local_48 = (DynamicTypeHandler *)this;
    if (isFixed || usedAsFixed) {
      TPropertyKey_IsInternalPropertyId(propertyKey);
      lVar2._0_1_ = local_48[1].propertyTypes;
      lVar2._1_1_ = local_48[1].flags;
      lVar2._2_2_ = local_48[1].offsetOfInlineSlots;
      lVar2._4_4_ = local_48[1].slotCapacity;
      if (lVar2 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x41c,
                                    "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                    ,
                                    "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                   );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
    }
    TPropertyKey_IsInternalPropertyId(propertyKey);
    this_00 = local_48;
    local_50._0_1_ = (usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02') + 1;
    local_38 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyKey;
    JsUtil::
    BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                *)local_48[1]._vptr_DynamicTypeHandler,(JavascriptString **)&local_38,&local_50);
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38 = &pJVar1->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    pPVar4 = local_38;
    bVar5 = NoSpecialPropertyCache::IsSpecialProperty(propertyKey);
    if ((bVar5) &&
       (this_00->propertyTypes = this_00->propertyTypes | 0x80, (this_00->flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar4);
    }
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
               &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    pPVar4 = local_38;
    if ((local_3c & 4) == 0) {
      DynamicTypeHandler::SetHasOnlyWritableDataProperties(this_00,false);
      if ((this_00->flags & 0x20) != 0) {
        propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
        ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar4);
      }
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }